

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mpi_write_hlp(mbedtls_mpi *X,int radix,char **p)

{
  byte *pbVar1;
  int iVar2;
  byte bVar3;
  mbedtls_mpi_uint r;
  ulong local_30;
  
  iVar2 = mbedtls_mpi_mod_int(&local_30,X,(ulong)(uint)radix);
  if ((iVar2 == 0) &&
     (iVar2 = mbedtls_mpi_div_int(X,(mbedtls_mpi *)0x0,X,(ulong)(uint)radix), iVar2 == 0)) {
    iVar2 = mbedtls_mpi_cmp_int(X,0);
    if ((iVar2 == 0) || (iVar2 = mpi_write_hlp(X,radix,p), iVar2 == 0)) {
      pbVar1 = (byte *)*p;
      *p = (char *)(pbVar1 + 1);
      bVar3 = (byte)local_30 + 0x37;
      if (local_30 < 10) {
        bVar3 = (byte)local_30 | 0x30;
      }
      *pbVar1 = bVar3;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int mpi_write_hlp( mbedtls_mpi *X, int radix, char **p )
{
    int ret;
    mbedtls_mpi_uint r;

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, radix ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_div_int( X, NULL, X, radix ) );

    if( mbedtls_mpi_cmp_int( X, 0 ) != 0 )
        MBEDTLS_MPI_CHK( mpi_write_hlp( X, radix, p ) );

    if( r < 10 )
        *(*p)++ = (char)( r + 0x30 );
    else
        *(*p)++ = (char)( r + 0x37 );

cleanup:

    return( ret );
}